

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O0

void Gia_ManPatchBufDriver(Gia_Man_t *p,int iBuf,int iLit0)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pObj;
  ulong uVar4;
  Gia_Obj_t *pObjBuf;
  int iLit0_local;
  int iBuf_local;
  Gia_Man_t *p_local;
  
  pObj = Gia_ManObj(p,iBuf);
  iVar1 = Gia_ObjIsBuf(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsBuf(pObjBuf)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                  ,0x113,"void Gia_ManPatchBufDriver(Gia_Man_t *, int, int)");
  }
  iVar1 = Gia_ObjId(p,pObj);
  iVar2 = Abc_Lit2Var(iLit0);
  if (iVar2 < iVar1) {
    iVar1 = Gia_ObjId(p,pObj);
    iVar2 = Abc_Lit2Var(iLit0);
    uVar4 = (ulong)(uint)(iVar1 - iVar2) & 0x1fffffff;
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffe0000000 | uVar4;
    *(ulong *)pObj = *(ulong *)pObj & 0xe0000000ffffffff | uVar4 << 0x20;
    uVar3 = Abc_LitIsCompl(iLit0);
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffdfffffff | ((ulong)uVar3 & 1) << 0x1d;
    *(ulong *)pObj = *(ulong *)pObj & 0xdfffffffffffffff | ((ulong)uVar3 & 1) << 0x3d;
    return;
  }
  __assert_fail("Gia_ObjId(p, pObjBuf) > Abc_Lit2Var(iLit0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieGia.c"
                ,0x114,"void Gia_ManPatchBufDriver(Gia_Man_t *, int, int)");
}

Assistant:

static inline void Gia_ManPatchBufDriver( Gia_Man_t * p, int iBuf, int iLit0 )  
{
    Gia_Obj_t * pObjBuf  = Gia_ManObj( p, iBuf );
    assert( Gia_ObjIsBuf(pObjBuf) );
    assert( Gia_ObjId(p, pObjBuf) > Abc_Lit2Var(iLit0) );
    pObjBuf->iDiff1  = pObjBuf->iDiff0  = Gia_ObjId(p, pObjBuf) - Abc_Lit2Var(iLit0);
    pObjBuf->fCompl1 = pObjBuf->fCompl0 = Abc_LitIsCompl(iLit0);
}